

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HEkkDebug.cpp
# Opt level: O2

HighsDebugStatus __thiscall
HEkk::debugOkForSolve(HEkk *this,SimplexAlgorithm algorithm,HighsInt phase)

{
  HighsOptions *pHVar1;
  byte bVar2;
  bool bVar3;
  HighsDebugStatus HVar4;
  uint uVar5;
  ulong uVar6;
  ulong uVar7;
  HighsDebugStatus HVar8;
  
  pHVar1 = this->options_;
  if ((pHVar1->super_HighsOptionsStruct).highs_debug_level < 1) {
    return kNotChecked;
  }
  if ((this->status_).has_basis == true) {
    bVar2 = (this->status_).has_ar_matrix;
    if ((((bool)bVar2 == true) && ((this->status_).has_nla == true)) &&
       ((this->status_).has_invert != false)) goto LAB_003356b5;
  }
  else {
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_basis = %d\n",0);
    bVar2 = (this->status_).has_ar_matrix;
  }
  if ((bVar2 & 1) == 0) {
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_ar_matrix = %d\n",0);
  }
  if ((this->status_).has_nla == false) {
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_nla = %d\n",0);
  }
  if ((this->status_).has_dual_steepest_edge_weights == false) {
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_dual_steepest_edge_weights = %d\n",0);
  }
  if ((this->status_).has_invert == false) {
    highsLogDev(&(pHVar1->super_HighsOptionsStruct).log_options,kError,
                "Not OK to solve since status.has_invert = %d\n",0);
  }
LAB_003356b5:
  HVar8 = kOk;
  if (1 < (this->options_->super_HighsOptionsStruct).highs_debug_level) {
    HVar4 = debugBasisConsistent(this);
    HVar8 = kLogicalError;
    if ((HVar4 != kLogicalError) && (bVar3 = debugWorkArraysOk(this,algorithm,phase), bVar3)) {
      uVar5 = (this->lp_).num_row_ + (this->lp_).num_col_;
      uVar7 = 0;
      uVar6 = (ulong)uVar5;
      if ((int)uVar5 < 1) {
        uVar6 = uVar7;
      }
      for (; uVar6 != uVar7; uVar7 = uVar7 + 1) {
        if (((this->basis_).nonbasicFlag_.
             super__Vector_base<signed_char,_std::allocator<signed_char>_>._M_impl.
             super__Vector_impl_data._M_start[uVar7] != '\0') &&
           (bVar3 = debugOneNonbasicMoveVsWorkArraysOk(this,(HighsInt)uVar7), !bVar3)) {
          return kLogicalError;
        }
      }
      HVar8 = kOk;
    }
  }
  return HVar8;
}

Assistant:

HighsDebugStatus HEkk::debugOkForSolve(const SimplexAlgorithm algorithm,
                                       const HighsInt phase) const {
  if (this->options_->highs_debug_level < kHighsDebugLevelCheap)
    return HighsDebugStatus::kNotChecked;
  const HighsDebugStatus return_status = HighsDebugStatus::kOk;
  const HighsLp& lp = this->lp_;
  const HighsSimplexStatus& status = this->status_;
  const SimplexBasis& basis = this->basis_;
  const HighsOptions& options = *this->options_;
  bool ok;
  // Minimal check - just look at flags. This means we trust them!
  ok = status.has_basis && status.has_ar_matrix && status.has_nla &&
       //       status.has_dual_steepest_edge_weights &&
       status.has_invert;
  if (!ok) {
    if (!status.has_basis)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_basis = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_basis);
    if (!status.has_ar_matrix)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_ar_matrix = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_ar_matrix);
    if (!status.has_nla)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_nla "
                  "= %" HIGHSINT_FORMAT "\n",
                  status.has_nla);
    if (!status.has_dual_steepest_edge_weights)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since "
                  "status.has_dual_steepest_edge_weights = %" HIGHSINT_FORMAT
                  "\n",
                  status.has_dual_steepest_edge_weights);
    if (!status.has_invert)
      highsLogDev(options.log_options, HighsLogType::kError,
                  "Not OK to solve since status.has_invert = "
                  "%" HIGHSINT_FORMAT "\n",
                  status.has_invert);
  }
  if (this->options_->highs_debug_level < kHighsDebugLevelCostly)
    return return_status;
  // Basis and data check
  if (this->debugBasisConsistent() == HighsDebugStatus::kLogicalError)
    return HighsDebugStatus::kLogicalError;
  // Check work cost, lower, upper and range
  if (!this->debugWorkArraysOk(algorithm, phase))
    return HighsDebugStatus::kLogicalError;
  const HighsInt numTot = lp.num_col_ + lp.num_row_;
  // Check nonbasic move against work cost, lower, upper and range
  for (HighsInt var = 0; var < numTot; ++var) {
    if (basis.nonbasicFlag_[var]) {
      // Nonbasic variable
      if (!this->debugOneNonbasicMoveVsWorkArraysOk(var))
        return HighsDebugStatus::kLogicalError;
    }
  }
  return return_status;
}